

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  undefined1 uVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  ulong uVar8;
  long *plVar9;
  
  uVar1 = (r1->high_low_container).size;
  if (uVar1 == (r2->high_low_container).size) {
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        if ((r1->high_low_container).keys[uVar8] != (r2->high_low_container).keys[uVar8])
        goto LAB_00108b99;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    iVar2 = (r1->high_low_container).size;
    bVar7 = iVar2 < 1;
    if (0 < iVar2) {
      bVar5 = *(r1->high_low_container).typecodes;
      if (bVar5 == 4) {
        bVar5 = *(byte *)((long)*(r1->high_low_container).containers + 8);
      }
      pbVar3 = (r2->high_low_container).typecodes;
      plVar9 = (long *)*(r2->high_low_container).containers;
      bVar6 = *pbVar3;
      if (bVar6 == 4) {
        bVar6 = *(byte *)(plVar9 + 1);
        plVar9 = (long *)*plVar9;
      }
      uVar4 = (*(code *)(&DAT_00120408 +
                        *(int *)(&DAT_00120408 + (ulong)(((uint)bVar6 + (uint)bVar5 * 4) - 5) * 4)))
                        (pbVar3,plVar9,bVar6,
                         &DAT_00120408 +
                         *(int *)(&DAT_00120408 + (ulong)(((uint)bVar6 + (uint)bVar5 * 4) - 5) * 4))
      ;
      return (_Bool)uVar4;
    }
  }
  else {
LAB_00108b99:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i], ra1->typecodes[i],
                                         ra2->containers[i], ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}